

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O2

size_t cache_getused(void)

{
  uint32_t uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = 0;
  uVar2 = cache_size;
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    uVar1 = cache_status[uVar4];
    if ((int)uVar1 < 0) {
      fwrite("cache_getuser: cache in use during cache_getused()\n",0x33,1,_stderr);
      uVar2 = cache_size;
    }
    sVar3 = (sVar3 + 1) - (ulong)(uVar1 == 0);
  }
  return sVar3;
}

Assistant:

size_t
cache_getused()
{
    size_t result = 0;
    for (size_t i=0;i<cache_size;i++) {
        uint32_t s = cache_status[i];
        if (s & 0x80000000) fprintf(stderr, "cache_getuser: cache in use during cache_getused()\n");
        if (s) result++;
    }
    return result;
}